

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptor.c
# Opt level: O0

void adapt_set_mllr(adapt_am_t *ad,mgau_model_t *g,char *mllrfile,char *cb2mllrname,mdef_t *mdef,
                   cmd_ln_t *config)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  double dVar4;
  uint32 local_4c;
  uint local_48;
  uint32 nmllr;
  uint32 ncb;
  float32 varfloor;
  int32 *cb2mllr;
  cmd_ln_t *config_local;
  mdef_t *mdef_local;
  char *cb2mllrname_local;
  char *mllrfile_local;
  mgau_model_t *g_local;
  adapt_am_t *ad_local;
  
  cb2mllr = &config->refcount;
  config_local = (cmd_ln_t *)mdef;
  mdef_local = (mdef_t *)cb2mllrname;
  cb2mllrname_local = mllrfile;
  mllrfile_local = (char *)g;
  g_local = (mgau_model_t *)ad;
  dVar4 = cmd_ln_float_r(config,"-varfloor");
  nmllr = (uint32)(float)dVar4;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/adaptor.c"
          ,0x73,"Reloading mean\n");
  pcVar1 = mllrfile_local;
  pcVar3 = cmd_ln_str_r((cmd_ln_t *)cb2mllr,"-mean");
  mgau_mean_reload((mgau_model_t *)pcVar1,pcVar3);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/adaptor.c"
          ,0x77,"Reloading variance\n");
  pcVar1 = mllrfile_local;
  pcVar3 = cmd_ln_str_r((cmd_ln_t *)cb2mllr,"-var");
  mgau_var_reload((mgau_model_t *)pcVar1,pcVar3);
  mgau_uninit_compact((mgau_model_t *)mllrfile_local);
  if ((*(long *)(*(long *)(mllrfile_local + 0x10) + 0x18) != 0) && (0.0 < (float)nmllr)) {
    mgau_var_floor((mgau_model_t *)mllrfile_local,(float64)(double)(float)nmllr);
  }
  mllr_read_regmat(cb2mllrname_local,(float32 ****)&g_local->veclen,(float32 ***)&g_local->mgau,
                   (float32 ***)&g_local->distfloor,&g_local->comp_type,
                   *(int32 *)(mllrfile_local + 8));
  if ((mdef_local == (mdef_t *)0x0) || (iVar2 = strcmp((char *)mdef_local,".1cls."), iVar2 == 0)) {
    _ncb = (int32 *)0x0;
  }
  else {
    cb2mllr_read((char *)mdef_local,(int32 **)&ncb,&local_48,&local_4c);
    if (local_4c != g_local->comp_type) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/adaptor.c"
              ,0x92,"Number of classes in cb2mllr does not match mllr (%d != %d)\n",(ulong)local_48,
              (ulong)(uint)g_local->comp_type);
      exit(1);
    }
    if (local_48 != *(uint *)&config_local->f_argv) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/adaptor.c"
              ,0x96,"Number of senones in cb2mllr does not match mdef (%d != %d)\n",(ulong)local_48,
              (ulong)*(uint *)&config_local->f_argv);
      exit(1);
    }
  }
  mllr_norm_mgau((mgau_model_t *)mllrfile_local,*(float32 ****)&g_local->veclen,
                 (float32 **)g_local->mgau,(float32 **)g_local->distfloor,g_local->comp_type,_ncb);
  ckd_free(_ncb);
  if ((*(long *)(*(long *)(mllrfile_local + 0x10) + 0x18) != 0) && (0.0 < (float)nmllr)) {
    mgau_var_floor((mgau_model_t *)mllrfile_local,(float64)(double)(float)nmllr);
  }
  mgau_precomp((mgau_model_t *)mllrfile_local);
  return;
}

Assistant:

void
adapt_set_mllr(adapt_am_t * ad, mgau_model_t * g, const char *mllrfile,
	       const char *cb2mllrname, mdef_t * mdef, cmd_ln_t *config)
{
    int32 *cb2mllr;
    float32 varfloor;
    
    varfloor = cmd_ln_float32_r(config, "-varfloor");

    /* Reread the gaussian mean from the file again */
    E_INFO("Reloading mean\n");
    mgau_mean_reload(g, cmd_ln_str_r(config, "-mean"));

    /* Reread the gaussian variance from the file again */
    E_INFO("Reloading variance\n");
    mgau_var_reload(g, cmd_ln_str_r(config, "-var"));

    mgau_uninit_compact(g);     /* Delete uninitialized components */

    if (g->mgau[0].var && varfloor > 0.0)
        mgau_var_floor(g, varfloor);    /* Variance floor after above compaction */

#if MLLR_DEBUG
    /*This generates huge amount of information */
    /*    mgau_dump(g,1); */
#endif

    /* Read in the mllr matrix */
    mllr_read_regmat(mllrfile,
                     &(ad->regA),
                     &(ad->regB),
		     &(ad->regH),
		     &(ad->mllr_nclass), mgau_veclen(g));

    if (cb2mllrname && strcmp(cb2mllrname, ".1cls.") != 0) {
        uint32 ncb, nmllr;

        cb2mllr_read(cb2mllrname, &cb2mllr, &ncb, &nmllr);
        if (nmllr != ad->mllr_nclass)
            E_FATAL
                ("Number of classes in cb2mllr does not match mllr (%d != %d)\n",
                 ncb, ad->mllr_nclass);
        if (ncb != mdef->n_sen)
            E_FATAL
                ("Number of senones in cb2mllr does not match mdef (%d != %d)\n",
                 ncb, mdef->n_sen);
    }
    else
        cb2mllr = NULL;

    /* Transform mean and variance vectors */
    mllr_norm_mgau(g, ad->regA, ad->regB, ad->regH, ad->mllr_nclass, cb2mllr);
    ckd_free(cb2mllr);

    if (g->mgau[0].var && varfloor > 0.0)
        mgau_var_floor(g, varfloor);    /* Variance floor after above transform */

    /* Re-precompute variance things */
    mgau_precomp(g);

#if MLLR_DEBUG
    /*#if 1 */
    mllr_dump(ad->regA, ad->regB, ad->regH, mgau_veclen(g), g->mllr_class, cb2mllr);
    /*This generates huge amount of information */
    /*mgau_dump(kbcore_mgau(kb->kbcore),1); */
#endif

}